

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O2

void doActivate<false>(QObject *sender,int signal_index,void **argv)

{
  ushort uVar1;
  __atomic_base<unsigned_int> _Var2;
  long lVar3;
  QObjectPrivate *this;
  AtomicType AVar4;
  QObjectData *pQVar5;
  QObjectData *pQVar6;
  AtomicType receiver;
  __pointer_type pQVar7;
  QObjectData *pQVar8;
  AtomicType AVar9;
  bool bVar10;
  uint uVar11;
  int iVar12;
  undefined4 extraout_var;
  char *pcVar13;
  undefined4 extraout_var_00;
  char *pcVar14;
  QMetaCallEvent *this_00;
  QObject *pQVar15;
  undefined4 extraout_var_01;
  uint uVar16;
  AtomicType AVar17;
  __pointer_type pSVar18;
  __base_type _Var19;
  Connection *c;
  long in_FS_OFFSET;
  QSemaphore semaphore;
  ConnectionDataPointer connections;
  QMessageLogger local_68;
  void *empty_argv [1];
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  this = (QObjectPrivate *)(sender->d_ptr).d;
  if (((this->super_QObjectData).field_0x30 & 2) == 0) {
    bVar10 = QObjectPrivate::isDeclarativeSignalConnected(this,signal_index);
    if (QAbstractDeclarativeData::signalEmitted !=
        (_func_void_QAbstractDeclarativeData_ptr_QObject_ptr_int_void_ptr_ptr *)0x0 && bVar10) {
      (*QAbstractDeclarativeData::signalEmitted)
                ((this->field_3).declarativeData,sender,signal_index,argv);
    }
    empty_argv[0] = (void *)0x0;
    if (argv == (void **)0x0) {
      argv = empty_argv;
    }
    bVar10 = QObjectPrivate::maybeSignalConnected(this,signal_index);
    if (bVar10) {
      connections.d.ptr =
           (totally_ordered_wrapper<QObjectPrivate::ConnectionData_*>)
           (this->connections).super_QBasicAtomicPointer<QObjectPrivate::ConnectionData>._q_value.
           _M_b._M_p;
      if (connections.d.ptr != (ConnectionData *)0x0) {
        LOCK();
        (((ConnectionData *)connections.d.ptr)->ref).super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value =
             (Type)((int)(((ConnectionData *)connections.d.ptr)->ref).super_QAtomicInteger<int>.
                         super_QBasicAtomicInteger<int>._q_value + 1);
        UNLOCK();
      }
      AVar4._M_b._M_p =
           (((ConnectionData *)connections.d.ptr)->signalVector).
           super_QBasicAtomicPointer<QObjectPrivate::SignalVector>._q_value._M_b;
      AVar17._M_b._M_p =
           (__base_type)(__pointer_type)((long)AVar4._M_b._M_p + ((long)signal_index + 1) * 0x10);
      if (*(int *)((long)AVar4._M_b._M_p + 8) <= signal_index) {
        AVar17._M_b._M_p = AVar4._M_b._M_p;
      }
      pQVar5 = *(QObjectData **)(in_FS_OFFSET + 0x10);
      pQVar6 = (sender->d_ptr).d[1].q_ptr[5].d_ptr.d;
      _Var2._M_i = *(__int_type_conflict3 *)
                    &(((ConnectionData *)connections.d.ptr)->currentConnectionId).
                     super_QBasicAtomicInteger<unsigned_int>._q_value;
      pSVar18 = (__pointer_type)((long)AVar17._M_b._M_p + 0x10);
      do {
        c = (pSVar18->super_ConnectionOrSignalVector).field_0.next;
        if (c != (Connection *)0x0) {
          do {
            receiver._M_b._M_p = *(__base_type *)&(c->receiver).super_QBasicAtomicPointer<QObject>;
            if (((AtomicType)receiver._M_b._M_p != (AtomicType)0x0) &&
               (pQVar7 = (c->receiverThreadData).super_QBasicAtomicPointer<QThreadData>._q_value.
                         _M_b._M_p, pQVar7 != (__pointer_type)0x0)) {
              if (pQVar5 == pQVar6) {
                _Var19._M_p = (pQVar7->threadId).super_QBasicAtomicPointer<void>._q_value._M_b._M_p;
              }
              else {
                local_68.context.version = -0x55555556;
                local_68.context.line = -0x55555556;
                local_68.context.file._0_1_ = true;
                local_68.context.file._1_3_ = 0xaaaaaa;
                local_68.context.file._4_4_ = 0xaaaaaaaa;
                QMutexLocker<QBasicMutex>::QMutexLocker
                          ((QMutexLocker<QBasicMutex> *)&local_68,
                           (QBasicMutex *)
                           ((long)&_q_ObjectMutexPool[0].d_ptr._q_value._M_b._M_p +
                           (ulong)((uint)(((ulong)receiver._M_b._M_p & 0xffffffff) % 0x418) & 0x7f8)
                           ));
                _Var19._M_p = (pQVar7->threadId).super_QBasicAtomicPointer<void>._q_value._M_b._M_p;
                QMutexLocker<QBasicMutex>::~QMutexLocker((QMutexLocker<QBasicMutex> *)&local_68);
              }
              uVar11 = *(uint *)&c->field_0x54;
              if ((pQVar5 == (QObjectData *)_Var19._M_p) || ((uVar11 & 0x18000000) != 0)) {
                uVar16 = uVar11 >> 0x1b & 3;
                if (uVar16 == 3) {
                  if (pQVar5 == (QObjectData *)_Var19._M_p) {
                    local_68.context.version = 2;
                    local_68.context.function._4_4_ = 0;
                    local_68.context.line = 0;
                    local_68.context.file._0_1_ = false;
                    local_68.context.file._1_3_ = 0;
                    local_68.context.file._4_4_ = 0;
                    local_68.context.function._0_4_ = 0;
                    local_68.context.category = "default";
                    iVar12 = (**sender->_vptr_QObject)();
                    pcVar13 = QMetaObject::className((QMetaObject *)CONCAT44(extraout_var,iVar12));
                    iVar12 = (***(_func_int ***)receiver._M_b._M_p)(receiver._M_b._M_p);
                    pcVar14 = QMetaObject::className
                                        ((QMetaObject *)CONCAT44(extraout_var_00,iVar12));
                    QMessageLogger::warning
                              (&local_68,
                               "Qt: Dead lock detected while activating a BlockingQueuedConnection: Sender is %s(%p), receiver is %s(%p)"
                               ,pcVar13,sender,pcVar14,receiver._M_b._M_p);
                    uVar11 = *(uint *)&c->field_0x54;
                  }
                  if ((int)uVar11 < 0) {
                    bVar10 = QObjectPrivate::removeConnection(c);
                    if (!bVar10) goto LAB_00291f22;
                  }
                  semaphore.field_0 =
                       (anon_union_8_4_8763c6f1_for_QSemaphore_0)&DAT_aaaaaaaaaaaaaaaa;
                  QSemaphore::QSemaphore(&semaphore,0);
                  local_68.context.version = -0x55555556;
                  local_68.context.line = -0x55555556;
                  local_68.context.file._0_1_ = true;
                  local_68.context.file._1_3_ = 0xaaaaaa;
                  local_68.context.file._4_4_ = 0xaaaaaaaa;
                  QMutexLocker<QBasicMutex>::QMutexLocker
                            ((QMutexLocker<QBasicMutex> *)&local_68,
                             (QBasicMutex *)
                             ((long)&_q_ObjectMutexPool[0].d_ptr._q_value._M_b._M_p +
                             (ulong)((uint)(((ulong)receiver._M_b._M_p & 0xffffffff) % 0x418) &
                                    0x7f8)));
                  uVar11 = *(uint *)&c->field_0x54;
                  if ((int)uVar11 < 0) {
LAB_0029202c:
                    if ((uVar11 >> 0x1d & 1) == 0) {
                      this_00 = (QMetaCallEvent *)operator_new(0x78);
                      QMetaCallEvent::QMetaCallEvent
                                (this_00,c->method_offset,c->method_relative,
                                 (c->field_6).callFunction,sender,signal_index,argv,&semaphore);
                    }
                    else {
                      this_00 = (QMetaCallEvent *)operator_new(0x78);
                      QMetaCallEvent::QMetaCallEvent
                                (this_00,(c->field_6).slotObj,sender,signal_index,argv,&semaphore);
                    }
                    QCoreApplication::postEvent((QObject *)receiver._M_b._M_p,(QEvent *)this_00,0);
                    QMutexLocker<QBasicMutex>::~QMutexLocker((QMutexLocker<QBasicMutex> *)&local_68)
                    ;
                    QSemaphore::acquire(&semaphore,1);
                  }
                  else {
                    if ((c->receiver).super_QBasicAtomicPointer<QObject>._q_value._M_b._M_p !=
                        (__pointer_type)0x0) {
                      uVar11 = *(uint *)&c->field_0x54;
                      goto LAB_0029202c;
                    }
                    QMutexLocker<QBasicMutex>::~QMutexLocker((QMutexLocker<QBasicMutex> *)&local_68)
                    ;
                  }
                  QSemaphore::~QSemaphore(&semaphore);
                  goto LAB_00291f22;
                }
                if (uVar16 != 2) {
                  if ((int)uVar11 < 0) {
                    bVar10 = QObjectPrivate::removeConnection(c);
                    if (!bVar10) goto LAB_00291f22;
                  }
                  pQVar15 = (QObject *)0x0;
                  AVar9._M_b._M_p = (__base_type)(__base_type)(QObject *)0x0;
                  if (pQVar5 == (QObjectData *)_Var19._M_p) {
                    pQVar15 = ((QScopedPointer<QObjectData,_QScopedPointerDeleter<QObjectData>_> *)
                              ((long)receiver._M_b._M_p + 8))->d[1].parent;
                    AVar9._M_b._M_p = receiver._M_b._M_p;
                  }
                  local_68.context.version = 0;
                  local_68.context.line = 0;
                  local_68.context.file._0_4_ = SUB84(AVar9._M_b._M_p,0);
                  local_68.context.file._4_4_ = (undefined4)((ulong)AVar9._M_b._M_p >> 0x20);
                  local_68.context.category = (char *)CONCAT44(0xaaaaaaaa,signal_index);
                  if (pQVar15 != (QObject *)0x0) {
                    pQVar8 = pQVar15[1].d_ptr.d;
                    local_68.context.version = (int)pQVar8;
                    local_68.context.line = (int)((ulong)pQVar8 >> 0x20);
                    pQVar15[1].d_ptr.d = (QObjectData *)&local_68;
                  }
                  local_68.context.function = (char *)sender;
                  if ((c->field_0x57 & 0x20) == 0) {
                    if ((c->field_6).callFunction != (StaticMetaCallFunction)0x0) {
                      uVar1 = c->method_offset;
                      iVar12 = (***(_func_int ***)receiver._M_b._M_p)(receiver._M_b._M_p);
                      iVar12 = QMetaObject::methodOffset
                                         ((QMetaObject *)CONCAT44(extraout_var_01,iVar12));
                      if ((int)(uint)uVar1 <= iVar12) {
                        (*(c->field_6).callFunction)
                                  ((QObject *)receiver._M_b._M_p,InvokeMetaMethod,
                                   (uint)c->method_relative,argv);
                        goto LAB_002921e7;
                      }
                    }
                    QMetaObject::metacall
                              ((QObject *)receiver._M_b._M_p,InvokeMetaMethod,
                               (uint)c->method_offset + (uint)c->method_relative,argv);
                  }
                  else {
                    semaphore.field_0 =
                         (anon_union_8_4_8763c6f1_for_QSemaphore_0)(c->field_6).slotObj;
                    LOCK();
                    *(int *)semaphore.field_0 = *(int *)semaphore.field_0 + 1;
                    UNLOCK();
                    (**(ImplFn *)((long)semaphore.field_0 + 8))
                              (1,(QSlotObjectBase *)semaphore.field_0,(QObject *)receiver._M_b._M_p,
                               argv,(bool *)0x0);
                    std::unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>
                    ::~unique_ptr((unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>
                                   *)&semaphore);
                  }
LAB_002921e7:
                  if (CONCAT44(local_68.context.file._4_4_,local_68.context.file._0_4_) != 0) {
                    *(ulong *)(*(long *)(*(long *)(CONCAT44(local_68.context.file._4_4_,
                                                            local_68.context.file._0_4_) + 8) + 0x60
                                        ) + 0x18) =
                         CONCAT44(local_68.context.line,local_68.context.version);
                  }
                  goto LAB_00291f22;
                }
              }
              queued_activate(sender,signal_index,c,argv);
            }
LAB_00291f22:
            c = (c->nextConnectionList).super_QBasicAtomicPointer<QObjectPrivate::Connection>.
                _q_value._M_b._M_p;
          } while ((c != (__pointer_type)0x0) && (c->id <= _Var2._M_i));
        }
        bVar10 = pSVar18 != (__pointer_type)((long)AVar4._M_b._M_p + 0x10U);
        pSVar18 = (__pointer_type)((long)AVar4._M_b._M_p + 0x10U);
      } while (bVar10);
      iVar12 = *(int *)connections.d.ptr;
      QExplicitlySharedDataPointer<QObjectPrivate::ConnectionData>::~QExplicitlySharedDataPointer
                (&connections);
      if (iVar12 != 0) {
        QObjectPrivate::ConnectionData::cleanOrphanedConnections
                  ((this->connections).super_QBasicAtomicPointer<QObjectPrivate::ConnectionData>.
                   _q_value._M_b._M_p,sender,NeedToLock);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void doActivate(QObject *sender, int signal_index, void **argv)
{
    QObjectPrivate *sp = QObjectPrivate::get(sender);

    if (sp->blockSig)
        return;

    Q_TRACE_SCOPE(QMetaObject_activate, sender, signal_index);

    if (sp->isDeclarativeSignalConnected(signal_index)
            && QAbstractDeclarativeData::signalEmitted) {
        Q_TRACE_SCOPE(QMetaObject_activate_declarative_signal, sender, signal_index);
        QAbstractDeclarativeData::signalEmitted(sp->declarativeData, sender,
                                                signal_index, argv);
    }

    const QSignalSpyCallbackSet *signal_spy_set = callbacks_enabled ? qt_signal_spy_callback_set.loadAcquire() : nullptr;

    void *empty_argv[] = { nullptr };
    if (!argv)
        argv = empty_argv;

    if (!sp->maybeSignalConnected(signal_index)) {
        // The possible declarative connection is done, and nothing else is connected
        if (callbacks_enabled && signal_spy_set->signal_begin_callback != nullptr)
            signal_spy_set->signal_begin_callback(sender, signal_index, argv);
        if (callbacks_enabled && signal_spy_set->signal_end_callback != nullptr)
            signal_spy_set->signal_end_callback(sender, signal_index);
        return;
    }

    if (callbacks_enabled && signal_spy_set->signal_begin_callback != nullptr)
        signal_spy_set->signal_begin_callback(sender, signal_index, argv);

    bool senderDeleted = false;
    {
    Q_ASSERT(sp->connections.loadRelaxed());
    QObjectPrivate::ConnectionDataPointer connections(sp->connections.loadAcquire());
    QObjectPrivate::SignalVector *signalVector = connections->signalVector.loadRelaxed();

    const QObjectPrivate::ConnectionList *list;
    if (signal_index < signalVector->count())
        list = &signalVector->at(signal_index);
    else
        list = &signalVector->at(-1);

    Qt::HANDLE currentThreadId = QThread::currentThreadId();
    bool inSenderThread = currentThreadId == QObjectPrivate::get(sender)->threadData.loadRelaxed()->threadId.loadRelaxed();

    // We need to check against the highest connection id to ensure that signals added
    // during the signal emission are not emitted in this emission.
    uint highestConnectionId = connections->currentConnectionId.loadRelaxed();
    do {
        QObjectPrivate::Connection *c = list->first.loadRelaxed();
        if (!c)
            continue;

        do {
            QObject * const receiver = c->receiver.loadRelaxed();
            if (!receiver)
                continue;

            QThreadData *td = c->receiverThreadData.loadRelaxed();
            if (!td)
                continue;

            bool receiverInSameThread;
            if (inSenderThread) {
                receiverInSameThread = currentThreadId == td->threadId.loadRelaxed();
            } else {
                // need to lock before reading the threadId, because moveToThread() could interfere
                QMutexLocker lock(signalSlotLock(receiver));
                receiverInSameThread = currentThreadId == td->threadId.loadRelaxed();
            }


            // determine if this connection should be sent immediately or
            // put into the event queue
            if ((c->connectionType == Qt::AutoConnection && !receiverInSameThread)
                || (c->connectionType == Qt::QueuedConnection)) {
                queued_activate(sender, signal_index, c, argv);
                continue;
#if QT_CONFIG(thread)
            } else if (c->connectionType == Qt::BlockingQueuedConnection) {
                if (receiverInSameThread) {
                    qWarning("Qt: Dead lock detected while activating a BlockingQueuedConnection: "
                    "Sender is %s(%p), receiver is %s(%p)",
                    sender->metaObject()->className(), sender,
                    receiver->metaObject()->className(), receiver);
                }

                if (c->isSingleShot && !QObjectPrivate::removeConnection(c))
                    continue;

                QSemaphore semaphore;
                {
                    QMutexLocker locker(signalSlotLock(receiver));
                    if (!c->isSingleShot && !c->receiver.loadAcquire())
                        continue;
                    QMetaCallEvent *ev = c->isSlotObject ?
                        new QMetaCallEvent(c->slotObj, sender, signal_index, argv, &semaphore) :
                        new QMetaCallEvent(c->method_offset, c->method_relative, c->callFunction,
                                           sender, signal_index, argv, &semaphore);
                    QCoreApplication::postEvent(receiver, ev);
                }
                semaphore.acquire();
                continue;
#endif
            }

            if (c->isSingleShot && !QObjectPrivate::removeConnection(c))
                continue;

            QObjectPrivate::Sender senderData(
                    receiverInSameThread ? receiver : nullptr, sender, signal_index,
                    receiverInSameThread ? QObjectPrivate::get(receiver)->connections.loadAcquire() : nullptr);

            if (c->isSlotObject) {
                SlotObjectGuard obj{c->slotObj};

                {
                    Q_TRACE_SCOPE(QMetaObject_activate_slot_functor, c->slotObj);
                    obj->call(receiver, argv);
                }
            } else if (c->callFunction && c->method_offset <= receiver->metaObject()->methodOffset()) {
                //we compare the vtable to make sure we are not in the destructor of the object.
                const int method_relative = c->method_relative;
                const auto callFunction = c->callFunction;
                const int methodIndex = (Q_HAS_TRACEPOINTS || callbacks_enabled) ? c->method() : 0;
                if (callbacks_enabled && signal_spy_set->slot_begin_callback != nullptr)
                    signal_spy_set->slot_begin_callback(receiver, methodIndex, argv);

                {
                    Q_TRACE_SCOPE(QMetaObject_activate_slot, receiver, methodIndex);
                    callFunction(receiver, QMetaObject::InvokeMetaMethod, method_relative, argv);
                }

                if (callbacks_enabled && signal_spy_set->slot_end_callback != nullptr)
                    signal_spy_set->slot_end_callback(receiver, methodIndex);
            } else {
                const int method = c->method_relative + c->method_offset;

                if (callbacks_enabled && signal_spy_set->slot_begin_callback != nullptr) {
                    signal_spy_set->slot_begin_callback(receiver, method, argv);
                }

                {
                    Q_TRACE_SCOPE(QMetaObject_activate_slot, receiver, method);
                    QMetaObject::metacall(receiver, QMetaObject::InvokeMetaMethod, method, argv);
                }

                if (callbacks_enabled && signal_spy_set->slot_end_callback != nullptr)
                    signal_spy_set->slot_end_callback(receiver, method);
            }
        } while ((c = c->nextConnectionList.loadRelaxed()) != nullptr && c->id <= highestConnectionId);

    } while (list != &signalVector->at(-1) &&
        //start over for all signals;
        ((list = &signalVector->at(-1)), true));

        if (connections->currentConnectionId.loadRelaxed() == 0)
            senderDeleted = true;
    }
    if (!senderDeleted) {
        sp->connections.loadAcquire()->cleanOrphanedConnections(sender);

        if (callbacks_enabled && signal_spy_set->signal_end_callback != nullptr)
            signal_spy_set->signal_end_callback(sender, signal_index);
    }
}